

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.h
# Opt level: O0

void __thiscall
xemmai::t_value<xemmai::t_slot>::f_call
          (t_value<xemmai::t_slot> *this,t_object *a_key,size_t *a_index,t_pvalue *a_stack,
          size_t a_n)

{
  t_type_of<xemmai::t_object> *this_00;
  t_value<xemmai::t_pointer> local_40;
  size_t local_30;
  size_t a_n_local;
  t_pvalue *a_stack_local;
  size_t *a_index_local;
  t_object *a_key_local;
  t_value<xemmai::t_slot> *this_local;
  
  local_30 = a_n;
  a_n_local = (size_t)a_stack;
  a_stack_local = (t_pvalue *)a_index;
  a_index_local = (size_t *)a_key;
  a_key_local = (t_object *)this;
  this_00 = f_type(this);
  xemmai::t_value<xemmai::t_pointer>::t_value<xemmai::t_slot>(&local_40,this);
  t_type_of<xemmai::t_object>::f_invoke
            (this_00,&local_40,(t_object *)a_index_local,(size_t *)a_stack_local,
             (t_pvalue *)a_n_local,local_30);
  return;
}

Assistant:

XEMMAI__PORTABLE__ALWAYS_INLINE inline void t_value<T_tag>::f_call(t_object* a_key, size_t& a_index, t_pvalue* a_stack, size_t a_n) const
{
	f_type()->f_invoke(*this, a_key, a_index, a_stack, a_n);
}